

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-uname.c
# Opt level: O2

int run_test_uname(void)

{
  int iVar1;
  char *pcVar2;
  undefined8 uStack_590;
  utsname buf;
  uv_utsname_t buffer;
  
  iVar1 = uv_os_uname((uv_utsname_t *)0x0);
  if (iVar1 == -0x16) {
    iVar1 = uv_os_uname(&buffer);
    if (iVar1 == 0) {
      iVar1 = uname((utsname *)&buf);
      if (iVar1 == -1) {
        pcVar2 = "uname(&buf) != -1";
        uStack_590 = 0x31;
      }
      else {
        iVar1 = strcmp(buffer.sysname,buf.sysname);
        if (iVar1 == 0) {
          iVar1 = strcmp(buffer.version,buf.version);
          if (iVar1 == 0) {
            iVar1 = strcmp(buffer.release,buf.release);
            if (iVar1 == 0) {
              iVar1 = strcmp(buffer.machine,buf.machine);
              if (iVar1 == 0) {
                return 0;
              }
              pcVar2 = "strcmp(buffer.machine, buf.machine) == 0";
              uStack_590 = 0x3f;
            }
            else {
              pcVar2 = "strcmp(buffer.release, buf.release) == 0";
              uStack_590 = 0x39;
            }
          }
          else {
            pcVar2 = "strcmp(buffer.version, buf.version) == 0";
            uStack_590 = 0x33;
          }
        }
        else {
          pcVar2 = "strcmp(buffer.sysname, buf.sysname) == 0";
          uStack_590 = 0x32;
        }
      }
    }
    else {
      pcVar2 = "r == 0";
      uStack_590 = 0x2e;
    }
  }
  else {
    pcVar2 = "r == UV_EINVAL";
    uStack_590 = 0x2a;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-uname.c",
          uStack_590,pcVar2);
  abort();
}

Assistant:

TEST_IMPL(uname) {
#ifndef _WIN32
  struct utsname buf;
#endif
#ifdef _AIX
  char temp[256];
#endif
  uv_utsname_t buffer;
  int r;

  /* Verify that NULL is handled properly. */
  r = uv_os_uname(NULL);
  ASSERT(r == UV_EINVAL);

  /* Verify the happy path. */
  r = uv_os_uname(&buffer);
  ASSERT(r == 0);

#ifndef _WIN32
  ASSERT(uname(&buf) != -1);
  ASSERT(strcmp(buffer.sysname, buf.sysname) == 0);
  ASSERT(strcmp(buffer.version, buf.version) == 0);

# ifdef _AIX
  snprintf(temp, sizeof(temp), "%s.%s", buf.version, buf.release);
  ASSERT(strcmp(buffer.release, temp) == 0);
# else
  ASSERT(strcmp(buffer.release, buf.release) == 0);
# endif /* _AIX */

# if defined(_AIX) || defined(__PASE__)
  ASSERT(strcmp(buffer.machine, "ppc64") == 0);
# else
  ASSERT(strcmp(buffer.machine, buf.machine) == 0);
# endif /* defined(_AIX) || defined(__PASE__) */

#endif /* _WIN32 */

  return 0;
}